

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkSuite.hpp
# Opt level: O2

void benchmarks::detail::
     BenchmarksClassRegistrar<benchmarks::MutexBenchmarks,_descriptors::mutex::std::RecursiveMutex,_descriptors::mutex::boost::Mutex,_descriptors::mutex::boost::RecursiveMutex>
     ::Register(BenchmarksMap *benchmarks)

{
  __shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<benchmarks::IBenchmark> b;
  MutexBenchmarks<descriptors::mutex::std::RecursiveMutex> bm;
  __shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  __shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2> *local_1a0;
  BenchmarksClass local_198;
  string local_160;
  string local_140;
  string local_120;
  BenchmarkId local_100;
  pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_> local_a0;
  
  MutexBenchmarks<descriptors::mutex::std::RecursiveMutex>::MutexBenchmarks
            ((MutexBenchmarks<descriptors::mutex::std::RecursiveMutex> *)&local_198);
  local_1a0 = &(local_198._benchmarks.
                super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
               super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var1 = &(local_198._benchmarks.
                  super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>;
      p_Var1 != local_1a0; p_Var1 = p_Var1 + 1) {
    std::__shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1b0,p_Var1);
    std::__cxx11::string::string((string *)&local_120,(string *)&local_198);
    (*(local_1b0._M_ptr)->_vptr_IBenchmark[2])(&local_140);
    descriptors::mutex::std::RecursiveMutex::GetName_abi_cxx11_();
    BenchmarkId::BenchmarkId(&local_100,&local_120,&local_140,&local_160);
    std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>::
    pair<benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_&,_true>
              (&local_a0,&local_100,(shared_ptr<benchmarks::IBenchmark> *)&local_1b0);
    std::
    _Rb_tree<benchmarks::BenchmarkId,std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>,std::_Select1st<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>,std::less<benchmarks::BenchmarkId>,std::allocator<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>>
    ::
    _M_insert_unique<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>
              ((_Rb_tree<benchmarks::BenchmarkId,std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>,std::_Select1st<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>,std::less<benchmarks::BenchmarkId>,std::allocator<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>>
                *)benchmarks,&local_a0);
    std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>::~pair
              (&local_a0);
    BenchmarkId::~BenchmarkId(&local_100);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
  }
  BenchmarksClassRegistrar<benchmarks::MutexBenchmarks,_descriptors::mutex::boost::Mutex,_descriptors::mutex::boost::RecursiveMutex>
  ::Register(benchmarks);
  BenchmarksClass::~BenchmarksClass(&local_198);
  return;
}

Assistant:

static void Register(BenchmarksMap& benchmarks)
			{
				BenchmarksClass_<ObjectsDescHead_> bm;
				for (auto b : bm.GetBenchmarks())
					benchmarks.insert({BenchmarkId(bm.GetName(), b->GetName(), ObjectsDescHead_::GetName()), b});

				BenchmarksClassRegistrar<BenchmarksClass_, ObjectsDescTail_...>::Register(benchmarks);
			}